

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.hpp
# Opt level: O1

void __thiscall
njoy::ENDFtk::ControlRecord::print<std::back_insert_iterator<std::__cxx11::string>>
          (ControlRecord *this,
          back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *it,int MAT,int MF,int MT)

{
  int local_68;
  int local_64;
  double local_60;
  int local_54;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  
  local_60 = (this->
             super_Base<njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>_>
             ).fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
             super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
             super__Head_base<1UL,_double,_false>._M_head_impl;
  local_38 = (this->
             super_Base<njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>_>
             ).fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
             super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
             super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
             _M_head_impl;
  local_40 = (this->
             super_Base<njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>_>
             ).fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
             super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
             super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>
             .super__Head_base<3UL,_long,_false>._M_head_impl;
  local_48 = ((_Head_base<4UL,_long,_false> *)
             ((long)&(this->
                     super_Base<njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>_>
                     ).fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                     super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                     super__Tuple_impl<2UL,_long,_long,_long,_long>.
                     super__Tuple_impl<3UL,_long,_long,_long>.super__Tuple_impl<4UL,_long,_long> + 8
             ))->_M_head_impl;
  local_50 = *(long *)&(this->
                       super_Base<njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>_>
                       ).fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                       super__Tuple_impl<2UL,_long,_long,_long,_long>.
                       super__Tuple_impl<3UL,_long,_long,_long>.super__Tuple_impl<4UL,_long,_long>;
  local_68 = MF;
  local_64 = MAT;
  local_54 = MT;
  tools::disco::ENDF::write<double,std::back_insert_iterator<std::__cxx11::string>>
            ((this->
             super_Base<njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>_>
             ).fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
             super__Head_base<0UL,_double,_false>._M_head_impl,it);
  tools::disco::ENDF::write<double,std::back_insert_iterator<std::__cxx11::string>>(local_60,it);
  tools::disco::Integer<11u>::write<long,std::back_insert_iterator<std::__cxx11::string>>
            (&local_38,it);
  tools::disco::
  Record<njoy::tools::disco::Integer<11u>,njoy::tools::disco::Integer<11u>,njoy::tools::disco::Integer<11u>,njoy::tools::disco::Integer<4u>,njoy::tools::disco::Integer<2u>,njoy::tools::disco::Integer<3u>,njoy::tools::disco::Column<5u>>
  ::write<std::back_insert_iterator<std::__cxx11::string>,long,long,long,int,int,int>
            (it,&local_40,&local_48,&local_50,&local_64,&local_68,&local_54);
  return;
}

Assistant:

void print( OutputIterator& it, int MAT, int MF, int MT ) const {

  using namespace njoy::tools;
  using Format = disco::Record< disco::ENDF, disco::ENDF,
                                disco::Integer< 11 >, disco::Integer< 11 >,
                                disco::Integer< 11 >, disco::Integer< 11 >,
                                disco::Integer< 4 >, disco::Integer< 2>,
                                disco::Integer< 3 >, disco::Column<5> >;
  Format::write( it,
                 this->C1(), this->C2(),
                 this->L1(), this->L2(),
                 this->N1(), this->N2(),
                 MAT, MF, MT );
}